

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O3

void av1_highbd_convolve_y_sr_avx2
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,int bd)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ushort uVar5;
  int16_t *piVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  long lVar9;
  long lVar10;
  undefined1 (*pauVar11) [16];
  long lVar12;
  undefined2 uVar13;
  uint16_t *puVar14;
  undefined2 uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar20 [32];
  
  uVar5 = filter_params_y->taps;
  if (uVar5 != 0xc) {
    uVar15 = 0xff;
    if (bd == 0xc) {
      uVar15 = 0xfff;
    }
    uVar13 = 0x3ff;
    if (bd != 10) {
      uVar13 = uVar15;
    }
    if (0 < w) {
      lVar10 = (long)(int)(((uVar5 >> 1) - 1) * src_stride);
      piVar6 = filter_params_y->filter_ptr;
      uVar18 = (ulong)((subpel_y_qn & 0xfU) * (uint)uVar5);
      uVar1 = *(undefined4 *)(piVar6 + uVar18 + 6);
      auVar19._4_4_ = uVar1;
      auVar19._0_4_ = uVar1;
      auVar19._8_4_ = uVar1;
      auVar19._12_4_ = uVar1;
      auVar20._16_4_ = uVar1;
      auVar20._0_16_ = auVar19;
      auVar20._20_4_ = uVar1;
      auVar20._24_4_ = uVar1;
      auVar20._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(piVar6 + uVar18 + 4);
      auVar21._4_4_ = uVar1;
      auVar21._0_4_ = uVar1;
      auVar21._8_4_ = uVar1;
      auVar21._12_4_ = uVar1;
      auVar21._16_4_ = uVar1;
      auVar21._20_4_ = uVar1;
      auVar21._24_4_ = uVar1;
      auVar21._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(piVar6 + uVar18 + 2);
      auVar22._4_4_ = uVar1;
      auVar22._0_4_ = uVar1;
      auVar22._8_4_ = uVar1;
      auVar22._12_4_ = uVar1;
      auVar22._16_4_ = uVar1;
      auVar22._20_4_ = uVar1;
      auVar22._24_4_ = uVar1;
      auVar22._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(piVar6 + uVar18);
      auVar23._4_4_ = uVar1;
      auVar23._0_4_ = uVar1;
      auVar23._8_4_ = uVar1;
      auVar23._12_4_ = uVar1;
      auVar23._16_4_ = uVar1;
      auVar23._20_4_ = uVar1;
      auVar23._24_4_ = uVar1;
      auVar23._28_4_ = uVar1;
      auVar24._2_2_ = uVar13;
      auVar24._0_2_ = uVar13;
      auVar24._4_2_ = uVar13;
      auVar24._6_2_ = uVar13;
      auVar24._8_2_ = uVar13;
      auVar24._10_2_ = uVar13;
      auVar24._12_2_ = uVar13;
      auVar24._14_2_ = uVar13;
      auVar24._16_2_ = uVar13;
      auVar24._18_2_ = uVar13;
      auVar24._20_2_ = uVar13;
      auVar24._22_2_ = uVar13;
      auVar24._24_2_ = uVar13;
      auVar24._26_2_ = uVar13;
      auVar24._28_2_ = uVar13;
      auVar24._30_2_ = uVar13;
      lVar9 = (long)dst_stride;
      lVar16 = (long)(src_stride * 8) * 2 + lVar10 * -2;
      lVar17 = (long)(src_stride * 7) * 2 + lVar10 * -2;
      uVar18 = 0;
      do {
        if (0 < h) {
          pauVar11 = (undefined1 (*) [16])(src + (uVar18 - lVar10));
          auVar2 = *(undefined1 (*) [16])(*pauVar11 + (long)(src_stride * 4) * 2);
          auVar3 = *(undefined1 (*) [16])(*pauVar11 + (long)(src_stride * 5) * 2);
          auVar26._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
          auVar26._16_16_ = ZEXT116(1) * auVar3;
          auVar4 = *(undefined1 (*) [16])(*pauVar11 + (long)(src_stride * 6) * 2);
          auVar29._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar4;
          auVar29._32_32_ = in_ZMM12._32_32_;
          auVar29._16_16_ = ZEXT116(1) * auVar19;
          auVar27._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar3;
          auVar27._16_16_ = ZEXT116(1) * auVar4;
          auVar7 = vpunpckhwd_avx2(auVar26,auVar27);
          auVar3 = *(undefined1 (*) [16])(*pauVar11 + (long)(src_stride * 2) * 2);
          auVar4 = *(undefined1 (*) [16])(*pauVar11 + (long)(src_stride * 3) * 2);
          auVar30._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar3;
          auVar30._16_16_ = ZEXT116(1) * auVar4;
          auVar28._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
          auVar28._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
          auVar31 = vpunpckhwd_avx2(auVar30,auVar28);
          auVar2 = *(undefined1 (*) [16])(*pauVar11 + (long)src_stride * 2);
          auVar32._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * *pauVar11;
          auVar32._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
          auVar33._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
          auVar33._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
          auVar25 = vpunpckhwd_avx2(auVar32,auVar33);
          auVar8 = vpunpcklwd_avx2(auVar26,auVar27);
          auVar26 = vpunpcklwd_avx2(auVar30,auVar28);
          auVar27 = vpunpcklwd_avx2(auVar32,auVar33);
          lVar12 = 0;
          pauVar11 = (undefined1 (*) [16])dst;
          puVar14 = src;
          in_ZMM12 = auVar29;
          do {
            auVar33 = auVar26;
            auVar32 = auVar31;
            auVar2 = *(undefined1 (*) [16])((long)puVar14 + lVar17);
            auVar34._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * in_ZMM12._0_16_;
            auVar34._16_16_ = ZEXT116(0) * in_ZMM12._16_16_ + ZEXT116(1) * auVar2;
            auVar3 = *(undefined1 (*) [16])((long)puVar14 + lVar16);
            auVar31._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
            auVar31._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
            auVar30 = vpunpcklwd_avx2(auVar34,auVar31);
            auVar28 = vpunpckhwd_avx2(auVar34,auVar31);
            auVar31 = vpmaddwd_avx2(auVar27,auVar23);
            auVar26 = vpmaddwd_avx2(auVar33,auVar22);
            auVar31 = vpaddd_avx2(auVar31,auVar26);
            auVar26 = vpmaddwd_avx2(auVar8,auVar21);
            auVar31 = vpaddd_avx2(auVar31,auVar26);
            auVar26 = vpmaddwd_avx2(auVar30,auVar20);
            auVar35._8_4_ = 0x40;
            auVar35._0_8_ = 0x4000000040;
            auVar35._12_4_ = 0x40;
            auVar35._16_4_ = 0x40;
            auVar35._20_4_ = 0x40;
            auVar35._24_4_ = 0x40;
            auVar35._28_4_ = 0x40;
            auVar31 = vpaddd_avx2(auVar31,auVar35);
            auVar31 = vpaddd_avx2(auVar31,auVar26);
            auVar31 = vpsrad_avx2(auVar31,7);
            if ((long)uVar18 < (long)((ulong)(uint)w - 4)) {
              auVar25 = vpmaddwd_avx2(auVar25,auVar23);
              auVar26 = vpmaddwd_avx2(auVar32,auVar22);
              auVar25 = vpaddd_avx2(auVar26,auVar25);
              auVar26 = vpmaddwd_avx2(auVar7,auVar21);
              auVar25 = vpaddd_avx2(auVar26,auVar25);
              auVar26 = vpmaddwd_avx2(auVar28,auVar20);
              auVar25 = vpaddd_avx2(auVar35,auVar25);
              auVar25 = vpaddd_avx2(auVar26,auVar25);
              auVar25 = vpsrad_avx2(auVar25,7);
              auVar31 = vpackssdw_avx2(auVar31,auVar25);
              auVar31 = vpminsw_avx2(auVar31,auVar24);
              auVar31 = vpmaxsw_avx2(auVar31,_DAT_0051c480);
              *pauVar11 = auVar31._0_16_;
              *(undefined1 (*) [16])((long)*pauVar11 + lVar9 * 2) = auVar31._16_16_;
            }
            else {
              auVar31 = vpackssdw_avx2(auVar31,auVar31);
              auVar31 = vpminsw_avx2(auVar31,auVar24);
              auVar31 = vpmaxsw_avx2(auVar31,_DAT_0051c480);
              if (w == 4) {
                *(long *)*pauVar11 = auVar31._0_8_;
                *(long *)((long)*pauVar11 + lVar9 * 2) = auVar31._16_8_;
              }
              else {
                *(int *)*pauVar11 = auVar31._0_4_;
                *(int *)((long)*pauVar11 + lVar9 * 2) = auVar31._16_4_;
              }
            }
            in_ZMM12 = ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                           ZEXT116(1) * auVar19,
                                           ZEXT116(0) * auVar19 + ZEXT116(1) * auVar3));
            lVar12 = lVar12 + 2;
            pauVar11 = (undefined1 (*) [16])((long)*pauVar11 + lVar9 * 2 * 2);
            puVar14 = puVar14 + (long)src_stride * 2;
            auVar31 = auVar7;
            auVar7 = auVar28;
            auVar25 = auVar32;
            auVar26 = auVar8;
            auVar8 = auVar30;
            auVar27 = auVar33;
          } while (lVar12 < h);
        }
        uVar18 = uVar18 + 8;
        dst = (uint16_t *)((long)dst + 0x10);
        lVar16 = lVar16 + 0x10;
        lVar17 = lVar17 + 0x10;
      } while (uVar18 < (uint)w);
    }
    return;
  }
  av1_highbd_convolve_y_sr_ssse3(src,src_stride,dst,dst_stride,w,h,filter_params_y,subpel_y_qn,bd);
  return;
}

Assistant:

void av1_highbd_convolve_y_sr_avx2(const uint16_t *src, int src_stride,
                                   uint16_t *dst, int dst_stride, int w, int h,
                                   const InterpFilterParams *filter_params_y,
                                   const int subpel_y_qn, int bd) {
  if (filter_params_y->taps == 12) {
    av1_highbd_convolve_y_sr_ssse3(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_y, subpel_y_qn, bd);
    return;
  }
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;

  __m256i s[8], coeffs_y[4];

  const int bits = FILTER_BITS;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    const uint16_t *data = &src_ptr[j];
    /* Vertical filter */
    {
      __m256i src6;
      __m256i s01 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 0 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 1 * src_stride))),
          0x20);
      __m256i s12 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 1 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 2 * src_stride))),
          0x20);
      __m256i s23 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 2 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 3 * src_stride))),
          0x20);
      __m256i s34 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 3 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 4 * src_stride))),
          0x20);
      __m256i s45 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 4 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 5 * src_stride))),
          0x20);
      src6 = _mm256_castsi128_si256(
          _mm_loadu_si128((__m128i *)(data + 6 * src_stride)));
      __m256i s56 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 5 * src_stride))),
          src6, 0x20);

      s[0] = _mm256_unpacklo_epi16(s01, s12);
      s[1] = _mm256_unpacklo_epi16(s23, s34);
      s[2] = _mm256_unpacklo_epi16(s45, s56);

      s[4] = _mm256_unpackhi_epi16(s01, s12);
      s[5] = _mm256_unpackhi_epi16(s23, s34);
      s[6] = _mm256_unpackhi_epi16(s45, s56);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        const __m256i s67 = _mm256_permute2x128_si256(
            src6,
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(data + 7 * src_stride))),
            0x20);

        src6 = _mm256_castsi128_si256(
            _mm_loadu_si128((__m128i *)(data + 8 * src_stride)));

        const __m256i s78 = _mm256_permute2x128_si256(
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(data + 7 * src_stride))),
            src6, 0x20);

        s[3] = _mm256_unpacklo_epi16(s67, s78);
        s[7] = _mm256_unpackhi_epi16(s67, s78);

        const __m256i res_a = convolve(s, coeffs_y);

        __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_bits), round_shift_bits);

        if (w - j > 4) {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_bits), round_shift_bits);

          __m256i res_16bit = _mm256_packs_epi32(res_a_round, res_b_round);
          res_16bit = _mm256_min_epi16(res_16bit, clip_pixel);
          res_16bit = _mm256_max_epi16(res_16bit, zero);

          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j],
                           _mm256_castsi256_si128(res_16bit));
          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           _mm256_extracti128_si256(res_16bit, 1));
        } else if (w == 4) {
          res_a_round = _mm256_packs_epi32(res_a_round, res_a_round);
          res_a_round = _mm256_min_epi16(res_a_round, clip_pixel);
          res_a_round = _mm256_max_epi16(res_a_round, zero);

          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j],
                           _mm256_castsi256_si128(res_a_round));
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           _mm256_extracti128_si256(res_a_round, 1));
        } else {
          res_a_round = _mm256_packs_epi32(res_a_round, res_a_round);
          res_a_round = _mm256_min_epi16(res_a_round, clip_pixel);
          res_a_round = _mm256_max_epi16(res_a_round, zero);

          xx_storel_32(&dst[i * dst_stride + j],
                       _mm256_castsi256_si128(res_a_round));
          xx_storel_32(&dst[i * dst_stride + j + dst_stride],
                       _mm256_extracti128_si256(res_a_round, 1));
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}